

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GammaHandler.cpp
# Opt level: O3

double __thiscall
GammaHandler::pairProduction
          (GammaHandler *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *sourceInfo,vector<double,_std::allocator<double>_> *xyTry)

{
  double *pdVar1;
  pointer pvVar2;
  long lVar3;
  
  pvVar2 = (sourceInfo->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(sourceInfo->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2;
  if (lVar3 != 0) {
    lVar3 = (lVar3 >> 3) * -0x5555555555555555;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    do {
      pdVar1 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (ABS((*pdVar1 + -1021.9978922) * -0.5 +
              *(xyTry->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start) < brThresh) {
        return (pdVar1[4] / (pdVar1[3] + pdVar1[2] + pdVar1[4])) * pdVar1[1] * yMax;
      }
      pvVar2 = pvVar2 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return 0.0;
}

Assistant:

double GammaHandler::pairProduction(const vector<vector<double>>& sourceInfo,
                                    const vector<double>& xyTry) {
  double energyScaleFactor =
      ElectronRestMassEnergy;  // mc^2 for electron mass in keV
  double initialEnergy, shiftedEnergy;
  // loop over allowed gamma energies
  for (int i = 0; i < sourceInfo.size(); i++) {
    double initialEnergy = sourceInfo[i][0];
    double br = sourceInfo[i][1];
    double pe = sourceInfo[i][2];
    double co = sourceInfo[i][3];
    double pp = sourceInfo[i][4];
    shiftedEnergy = (0.5) * (initialEnergy -
                             2 * energyScaleFactor);  // Pair production energy
    if (abs(xyTry[0] - shiftedEnergy) < brThresh) {
      return yMax * br * (pp / (pe + co + pp));
    }
  }
  return 0.0;
}